

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl-util.h
# Opt level: O2

void STLDeleteElementsAndClear<std::vector<std::vector<xLearn::Node,std::allocator<xLearn::Node>>*,std::allocator<std::vector<xLearn::Node,std::allocator<xLearn::Node>>*>>>
               (vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
                *c)

{
  _Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_> *this;
  pointer ppvVar1;
  pointer ppvVar2;
  
  for (ppvVar2 = (c->
                 super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      ppvVar2 !=
      (c->
      super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
      )._M_impl.super__Vector_impl_data._M_finish; ppvVar2 = ppvVar2 + 1) {
    this = &(*ppvVar2)->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>;
    if (this != (_Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_> *)0x0) {
      std::_Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>::~_Vector_base(this);
      operator_delete(this);
    }
  }
  ppvVar1 = (c->
            super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (ppvVar2 != ppvVar1) {
    (c->
    super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
    )._M_impl.super__Vector_impl_data._M_finish = ppvVar1;
  }
  return;
}

Assistant:

void STLDeleteElementsAndClear(Container* c) {
  for (typename Container::iterator iter = c->begin();
       iter != c->end(); ++iter) {
    if (*iter != NULL) {
      delete *iter;
    }
  }
  c->clear();
}